

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string input;
  Options options;
  CompileContext context;
  undefined1 *local_3a0;
  undefined8 local_398;
  undefined1 local_390 [16];
  string local_380;
  Options local_360;
  Options local_2b8;
  CompileContext local_210;
  
  enact::Options::Options(&local_2b8,argc,argv);
  enact::Options::Options(&local_360,&local_2b8);
  enact::CompileContext::CompileContext(&local_210,&local_360);
  enact::Options::~Options(&local_360);
  do {
    std::operator<<((ostream *)&std::cout,"enact > ");
    local_3a0 = local_390;
    local_398 = 0;
    local_390[0] = 0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_3a0);
    std::__cxx11::string::string((string *)&local_380,(string *)&local_3a0);
    enact::CompileContext::compile(&local_210,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    //enact::Options options{argc, argv};
    //enact::CompileContext context{options};

    //return static_cast<int>(context.run());

    enact::Options options{argc, argv};
    enact::CompileContext context{options};

    while (true) {
        std::cout << "enact > ";
        std::string input;
        std::getline(std::cin, input);

        context.compile(input);
    }
}